

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_endStream(ZSTD_CStream *zcs,ZSTD_outBuffer *output)

{
  uint uVar1;
  int iVar2;
  size_t code;
  ZSTD_inBuffer *in_RSI;
  ZSTD_outBuffer *in_RDI;
  size_t toFlush;
  size_t checksumSize;
  size_t lastBlockSize;
  size_t err_code;
  size_t remainingToFlush;
  ZSTD_inBuffer input;
  int local_5c;
  ZSTD_CStream *in_stack_ffffffffffffffc0;
  size_t sVar3;
  ZSTD_EndDirective in_stack_ffffffffffffffe4;
  ZSTD_CCtx *in_stack_fffffffffffffff8;
  
  inBuffer_forEndFlush(in_stack_ffffffffffffffc0);
  code = ZSTD_compressStream2(in_stack_fffffffffffffff8,in_RDI,in_RSI,in_stack_ffffffffffffffe4);
  sVar3 = code;
  uVar1 = ERR_isError(code);
  if ((uVar1 == 0) && (sVar3 = code, *(int *)((long)&in_RDI[0xc].size + 4) < 1)) {
    iVar2 = 3;
    if (*(int *)((long)&in_RDI[0x95].size + 4) != 0) {
      iVar2 = 0;
    }
    if (*(int *)((long)&in_RDI[0x95].size + 4) == 0) {
      local_5c = *(int *)((long)&in_RDI[10].pos + 4) << 2;
    }
    else {
      local_5c = 0;
    }
    sVar3 = code + (long)iVar2 + (long)local_5c;
  }
  return sVar3;
}

Assistant:

size_t ZSTD_endStream(ZSTD_CStream* zcs, ZSTD_outBuffer* output)
{
    ZSTD_inBuffer input = inBuffer_forEndFlush(zcs);
    size_t const remainingToFlush = ZSTD_compressStream2(zcs, output, &input, ZSTD_e_end);
    FORWARD_IF_ERROR(remainingToFlush , "ZSTD_compressStream2(,,ZSTD_e_end) failed");
    if (zcs->appliedParams.nbWorkers > 0) return remainingToFlush;   /* minimal estimation */
    /* single thread mode : attempt to calculate remaining to flush more precisely */
    {   size_t const lastBlockSize = zcs->frameEnded ? 0 : ZSTD_BLOCKHEADERSIZE;
        size_t const checksumSize = (size_t)(zcs->frameEnded ? 0 : zcs->appliedParams.fParams.checksumFlag * 4);
        size_t const toFlush = remainingToFlush + lastBlockSize + checksumSize;
        DEBUGLOG(4, "ZSTD_endStream : remaining to flush : %u", (unsigned)toFlush);
        return toFlush;
    }
}